

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::
TestFactoryImpl<bidfx_public_api::price::pixie::EncodingUtilTest_TestCanNotCreateAPowerOfTenBiggerThanJavaMaxInt_Test>
::CreateTest(TestFactoryImpl<bidfx_public_api::price::pixie::EncodingUtilTest_TestCanNotCreateAPowerOfTenBiggerThanJavaMaxInt_Test>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)0x3cd203af9ee75616;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_0029e4f0;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }